

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

bool __thiscall Client::Connect(Client *this,IPAddress *addr,uint16_t port)

{
  uint uVar1;
  impl_ *piVar2;
  int iVar3;
  time_t tVar4;
  
  piVar2 = (this->impl)._M_t.
           super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
           super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
           super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl;
  (piVar2->sin).sin_family = 0;
  (piVar2->sin).sin_port = 0;
  (piVar2->sin).sin_addr = 0;
  (piVar2->sin).sin_zero[0] = '\0';
  (piVar2->sin).sin_zero[1] = '\0';
  (piVar2->sin).sin_zero[2] = '\0';
  (piVar2->sin).sin_zero[3] = '\0';
  (piVar2->sin).sin_zero[4] = '\0';
  (piVar2->sin).sin_zero[5] = '\0';
  (piVar2->sin).sin_zero[6] = '\0';
  (piVar2->sin).sin_zero[7] = '\0';
  (((this->impl)._M_t.super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t
    .super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
    super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sin).sin_family = 2;
  uVar1 = addr->address;
  (((this->impl)._M_t.super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t
    .super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
    super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sin).sin_addr.s_addr =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (((this->impl)._M_t.super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t
    .super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
    super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl)->sin).sin_port =
       port << 8 | port >> 8;
  piVar2 = (this->impl)._M_t.
           super___uniq_ptr_impl<Client::impl_,_std::default_delete<Client::impl_>_>._M_t.
           super__Tuple_impl<0UL,_Client::impl__*,_std::default_delete<Client::impl_>_>.
           super__Head_base<0UL,_Client::impl__*,_false>._M_head_impl;
  iVar3 = connect(piVar2->sock,(sockaddr *)&piVar2->sin,0x10);
  if (iVar3 == 0) {
    tVar4 = time((time_t *)0x0);
    this->connect_time = tVar4;
  }
  this->connected = iVar3 == 0;
  return iVar3 == 0;
}

Assistant:

bool Client::Connect(const IPAddress &addr, uint16_t port)
{
	std::memset(&this->impl->sin, 0, sizeof(this->impl->sin));
	this->impl->sin.sin_family = AF_INET;
	this->impl->sin.sin_addr.s_addr = htonl(addr);
	this->impl->sin.sin_port = htons(port);

	if (connect(this->impl->sock, reinterpret_cast<sockaddr *>(&this->impl->sin), sizeof(this->impl->sin)) != 0)
	{
		return this->connected = false;
	}

	this->connect_time = std::time(0);

	return this->connected = true;
}